

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O1

void writeimage(void)

{
  int iVar1;
  void *__ptr;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int status;
  fitsfile *fptr;
  long naxes [2];
  char filename [13];
  long exposure;
  unsigned_short *array [200];
  int local_694;
  undefined8 local_690;
  long local_688;
  long lStack_680;
  char local_670 [16];
  undefined8 local_660;
  void *local_658 [200];
  
  builtin_strncpy(local_670 + 8,".fit",5);
  builtin_strncpy(local_670,"atestfil",8);
  local_688 = 300;
  lStack_680 = 200;
  __ptr = malloc(120000);
  lVar3 = 1;
  pvVar2 = __ptr;
  do {
    pvVar2 = (void *)((long)pvVar2 + 600);
    local_658[lVar3] = pvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 200);
  local_658[0] = __ptr;
  remove(local_670);
  local_694 = 0;
  iVar1 = ffinit(&local_690,local_670);
  if (iVar1 != 0) {
    printerror(local_694);
  }
  iVar1 = ffcrim(local_690,0x14,2,&local_688,&local_694);
  if (iVar1 != 0) {
    printerror(local_694);
  }
  if (0 < lStack_680) {
    lVar3 = 0;
    do {
      if (0 < local_688) {
        pvVar2 = local_658[lVar3];
        lVar4 = 0;
        do {
          *(short *)((long)pvVar2 + lVar4 * 2) = (short)lVar3 + (short)lVar4;
          lVar4 = lVar4 + 1;
        } while (local_688 != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lStack_680);
  }
  iVar1 = ffppr(local_690,0x14,1,lStack_680 * local_688,__ptr,&local_694);
  if (iVar1 != 0) {
    printerror(local_694);
  }
  free(__ptr);
  local_660 = 0x5dc;
  iVar1 = ffuky(local_690,0x29,"EXPOSURE",&local_660,"Total Exposure Time",&local_694);
  if (iVar1 != 0) {
    printerror(local_694);
  }
  iVar1 = ffclos(local_690,&local_694);
  if (iVar1 != 0) {
    printerror(local_694);
  }
  return;
}

Assistant:

void writeimage( void )

    /******************************************************/
    /* Create a FITS primary array containing a 2-D image */
    /******************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, ii, jj;
    long  fpixel, nelements, exposure;
    unsigned short *array[200];

    /* initialize FITS image parameters */
    char filename[] = "atestfil.fit";             /* name for new FITS file */
    int bitpix   =  USHORT_IMG; /* 16-bit unsigned short pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = { 300, 200 };   /* image is 300 pixels wide by 200 rows */

    /* allocate memory for the whole image */ 
    array[0] = (unsigned short *)malloc( naxes[0] * naxes[1]
                                        * sizeof( unsigned short ) );

    /* initialize pointers to the start of each row of the image */
    for( ii=1; ii<naxes[1]; ii++ )
      array[ii] = array[ii-1] + naxes[0];

    remove(filename);               /* Delete old file if it already exists */

    status = 0;         /* initialize status before calling fitsio routines */

    if (fits_create_file(&fptr, filename, &status)) /* create new FITS file */
         printerror( status );           /* call printerror if error occurs */

    /* write the required keywords for the primary array image.     */
    /* Since bitpix = USHORT_IMG, this will cause cfitsio to create */
    /* a FITS image with BITPIX = 16 (signed short integers) with   */
    /* BSCALE = 1.0 and BZERO = 32768.  This is the convention that */
    /* FITS uses to store unsigned integers.  Note that the BSCALE  */
    /* and BZERO keywords will be automatically written by cfitsio  */
    /* in this case.                                                */

    if ( fits_create_img(fptr,  bitpix, naxis, naxes, &status) )
         printerror( status );          

    /* initialize the values in the image with a linear ramp function */
    for (jj = 0; jj < naxes[1]; jj++)
    {   for (ii = 0; ii < naxes[0]; ii++)
        {
            array[jj][ii] = ii + jj;
        }
    }

    fpixel = 1;                               /* first pixel to write      */
    nelements = naxes[0] * naxes[1];          /* number of pixels to write */

    /* write the array of unsigned integers to the FITS file */
    if ( fits_write_img(fptr, TUSHORT, fpixel, nelements, array[0], &status) )
        printerror( status );
      
    free( array[0] );  /* free previously allocated memory */

    /* write another optional keyword to the header */
    /* Note that the ADDRESS of the value is passed in the routine */
    exposure = 1500;
    if ( fits_update_key(fptr, TLONG, "EXPOSURE", &exposure,
         "Total Exposure Time", &status) )
         printerror( status );           

    if ( fits_close_file(fptr, &status) )                /* close the file */
         printerror( status );           

    return;
}